

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *__ptr;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  void *pvVar12;
  void *pvVar13;
  long in_RSI;
  long in_RDI;
  OPJ_INT32 top_k;
  OPJ_INT32 k;
  OPJ_UINT16 pcol;
  OPJ_UINT16 cmp;
  OPJ_UINT16 nr_channels;
  OPJ_UINT16 i;
  OPJ_UINT32 max;
  OPJ_UINT32 j;
  OPJ_INT32 *dst;
  OPJ_INT32 *src;
  opj_jp2_cmap_comp_t *cmap;
  OPJ_UINT32 *entries;
  OPJ_BYTE *channel_sign;
  OPJ_BYTE *channel_size;
  opj_image_comp_t *new_comps;
  opj_image_comp_t *old_comps;
  int local_64;
  ushort local_5a;
  uint local_54;
  
  lVar5 = *(long *)(*(long *)(in_RSI + 0x18) + 0x10);
  lVar6 = *(long *)(*(long *)(in_RSI + 0x18) + 8);
  lVar7 = **(long **)(in_RSI + 0x18);
  lVar8 = *(long *)(*(long *)(in_RSI + 0x18) + 0x18);
  uVar1 = *(ushort *)(*(long *)(in_RSI + 0x18) + 0x22);
  __ptr = *(void **)(in_RDI + 0x18);
  pvVar12 = malloc((ulong)uVar1 * 0x38);
  for (local_5a = 0; local_5a < uVar1; local_5a = local_5a + 1) {
    uVar9 = (ushort)*(byte *)(lVar8 + 3 + (ulong)local_5a * 4);
    uVar10 = *(ushort *)(lVar8 + (ulong)local_5a * 4);
    memcpy((void *)((long)pvVar12 + (ulong)uVar9 * 0x38),
           (void *)((long)__ptr + (ulong)uVar10 * 0x38),0x38);
    if (*(char *)(lVar8 + 2 + (ulong)local_5a * 4) == '\0') {
      *(undefined8 *)((long)__ptr + (ulong)uVar10 * 0x38 + 0x30) = 0;
    }
    else {
      pvVar13 = malloc((ulong)(uint)(*(int *)((long)__ptr + (ulong)uVar10 * 0x38 + 8) *
                                    *(int *)((long)__ptr + (ulong)uVar10 * 0x38 + 0xc)) << 2);
      *(void **)((long)pvVar12 + (ulong)uVar9 * 0x38 + 0x30) = pvVar13;
      *(uint *)((long)pvVar12 + (ulong)uVar9 * 0x38 + 0x18) =
           (uint)*(byte *)(lVar5 + (ulong)local_5a);
      *(uint *)((long)pvVar12 + (ulong)uVar9 * 0x38 + 0x20) =
           (uint)*(byte *)(lVar6 + (ulong)local_5a);
    }
  }
  iVar11 = *(ushort *)(*(long *)(in_RSI + 0x18) + 0x20) - 1;
  for (local_5a = 0; local_5a < uVar1; local_5a = local_5a + 1) {
    if (*(char *)(lVar8 + 2 + (ulong)local_5a * 4) != '\0') {
      uVar10 = (ushort)*(byte *)(lVar8 + 3 + (ulong)local_5a * 4);
      lVar5 = *(long *)((long)__ptr + (ulong)*(ushort *)(lVar8 + (ulong)local_5a * 4) * 0x38 + 0x30)
      ;
      lVar6 = *(long *)((long)pvVar12 + (ulong)uVar10 * 0x38 + 0x30);
      iVar2 = *(int *)((long)pvVar12 + (ulong)uVar10 * 0x38 + 8);
      iVar3 = *(int *)((long)pvVar12 + (ulong)uVar10 * 0x38 + 0xc);
      for (local_54 = 0; local_54 < (uint)(iVar2 * iVar3); local_54 = local_54 + 1) {
        local_64 = *(int *)(lVar5 + (ulong)local_54 * 4);
        if (local_64 < 0) {
          local_64 = 0;
        }
        else if (iVar11 < local_64) {
          local_64 = iVar11;
        }
        *(undefined4 *)(lVar6 + (ulong)local_54 * 4) =
             *(undefined4 *)(lVar7 + (long)(int)(local_64 * (uint)uVar1 + (uint)uVar10) * 4);
      }
    }
  }
  uVar4 = *(uint *)(in_RDI + 0x10);
  for (local_5a = 0; local_5a < uVar4; local_5a = local_5a + 1) {
    if (*(long *)((long)__ptr + (ulong)local_5a * 0x38 + 0x30) != 0) {
      free(*(void **)((long)__ptr + (ulong)local_5a * 0x38 + 0x30));
    }
  }
  free(__ptr);
  *(void **)(in_RDI + 0x18) = pvVar12;
  *(uint *)(in_RDI + 0x10) = (uint)uVar1;
  jp2_free_pclr((opj_jp2_color_t *)0x2bc8f8);
  return;
}

Assistant:

static void jp2_apply_pclr(opj_image_t *image, opj_jp2_color_t *color)
{
	opj_image_comp_t *old_comps, *new_comps;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	opj_jp2_cmap_comp_t *cmap;
	OPJ_INT32 *src, *dst;
	OPJ_UINT32 j, max;
	OPJ_UINT16 i, nr_channels, cmp, pcol;
	OPJ_INT32 k, top_k;

	channel_size = color->jp2_pclr->channel_size;
	channel_sign = color->jp2_pclr->channel_sign;
	entries = color->jp2_pclr->entries;
	cmap = color->jp2_pclr->cmap;
	nr_channels = color->jp2_pclr->nr_channels;

	old_comps = image->comps;
	new_comps = (opj_image_comp_t*)
			opj_malloc(nr_channels * sizeof(opj_image_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		pcol = cmap[i].pcol; cmp = cmap[i].cmp;

		new_comps[pcol] = old_comps[cmp];

		/* Direct use */
		if(cmap[i].mtyp == 0){
			old_comps[cmp].data = NULL; continue;
		}

		/* Palette mapping: */
		new_comps[pcol].data = (int*)
				opj_malloc(old_comps[cmp].w * old_comps[cmp].h * sizeof(int));
		new_comps[pcol].prec = channel_size[i];
		new_comps[pcol].sgnd = channel_sign[i];
	}

	top_k = color->jp2_pclr->nr_entries - 1;

	for(i = 0; i < nr_channels; ++i) {
		/* Direct use: */
		if(cmap[i].mtyp == 0) continue;

		/* Palette mapping: */
		cmp = cmap[i].cmp; pcol = cmap[i].pcol;
		src = old_comps[cmp].data;
		dst = new_comps[pcol].data;
		max = new_comps[pcol].w * new_comps[pcol].h;

		for(j = 0; j < max; ++j)
		{
			/* The index */
			if((k = src[j]) < 0) k = 0; else if(k > top_k) k = top_k;

			/* The colour */
			dst[j] = entries[k * nr_channels + pcol];
		}
	}

	max = image->numcomps;
	for(i = 0; i < max; ++i) {
		if(old_comps[i].data) opj_free(old_comps[i].data);
	}

	opj_free(old_comps);
	image->comps = new_comps;
	image->numcomps = nr_channels;

	jp2_free_pclr(color);

}